

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psconv.c
# Opt level: O0

FT_Long PS_Conv_Strtol(FT_Byte **cursor,FT_Byte *limit,FT_Long base)

{
  char cVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  bool bVar4;
  FT_Byte **ppFVar5;
  bool bVar6;
  FT_Char c;
  FT_Char c_limit;
  FT_Long num_limit;
  FT_Bool have_overflow;
  FT_Byte **ppFStack_38;
  FT_Bool sign;
  FT_Long num;
  FT_Byte *p;
  FT_Long base_local;
  FT_Byte *limit_local;
  FT_Byte **cursor_local;
  
  num = (FT_Long)*cursor;
  ppFStack_38 = (FT_Byte **)0x0;
  bVar6 = false;
  bVar4 = false;
  if ((ulong)num < limit) {
    if ((base < 2) || (0x24 < base)) {
      return 0;
    }
    if ((*(FT_Byte *)num == '-') || (*(FT_Byte *)num == '+')) {
      bVar6 = *(FT_Byte *)num == '-';
      num = num + 1;
      if ((FT_Byte *)num == limit) goto LAB_00309851;
      if ((*(FT_Byte *)num == '-') || (*(FT_Byte *)num == '+')) {
        return 0;
      }
    }
    auVar2._8_8_ = 0;
    auVar2._0_8_ = SUB168(SEXT816(0x7fffffff),8);
    ppFVar5 = SUB168((auVar2 << 0x40 | ZEXT816(0x7fffffff)) / SEXT816(base),0);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = SUB168(SEXT816(0x7fffffff),8);
    while ((((((((ulong)num < limit && (*(char *)num != ' ')) && (*(char *)num != '\r')) &&
              ((*(char *)num != '\n' && (*(char *)num != '\t')))) &&
             ((*(char *)num != '\f' && ((*(char *)num != '\0' && (*(byte *)num < 0x80)))))) &&
            (cVar1 = ft_char_table[(int)(*(byte *)num & 0x7f)], -1 < cVar1)) && (cVar1 < base))) {
      if (((long)ppFVar5 < (long)ppFStack_38) ||
         ((ppFStack_38 == ppFVar5 &&
          (SUB161((auVar3 << 0x40 | ZEXT816(0x7fffffff)) % SEXT816(base),0) < cVar1)))) {
        bVar4 = true;
      }
      else {
        ppFStack_38 = (FT_Byte **)((long)ppFStack_38 * base + (long)cVar1);
      }
      num = num + 1;
    }
    *cursor = (FT_Byte *)num;
    if (bVar4) {
      ppFStack_38 = (FT_Byte **)0x7fffffff;
    }
    if (bVar6) {
      ppFStack_38 = (FT_Byte **)-(long)ppFStack_38;
    }
    cursor_local = ppFStack_38;
  }
  else {
LAB_00309851:
    cursor_local = (FT_Byte **)0x0;
  }
  return (FT_Long)cursor_local;
}

Assistant:

FT_LOCAL_DEF( FT_Long )
  PS_Conv_Strtol( FT_Byte**  cursor,
                  FT_Byte*   limit,
                  FT_Long    base )
  {
    FT_Byte*  p = *cursor;

    FT_Long   num           = 0;
    FT_Bool   sign          = 0;
    FT_Bool   have_overflow = 0;

    FT_Long   num_limit;
    FT_Char   c_limit;


    if ( p >= limit )
      goto Bad;

    if ( base < 2 || base > 36 )
    {
      FT_TRACE4(( "!!!INVALID BASE:!!!" ));
      return 0;
    }

    if ( *p == '-' || *p == '+' )
    {
      sign = FT_BOOL( *p == '-' );

      p++;
      if ( p == limit )
        goto Bad;

      /* only a single sign is allowed */
      if ( *p == '-' || *p == '+' )
        return 0;
    }

    num_limit = 0x7FFFFFFFL / base;
    c_limit   = (FT_Char)( 0x7FFFFFFFL % base );

    for ( ; p < limit; p++ )
    {
      FT_Char  c;


      if ( IS_PS_SPACE( *p ) || *p OP 0x80 )
        break;

      c = ft_char_table[*p & 0x7F];

      if ( c < 0 || c >= base )
        break;

      if ( num > num_limit || ( num == num_limit && c > c_limit ) )
        have_overflow = 1;
      else
        num = num * base + c;
    }

    *cursor = p;

    if ( have_overflow )
    {
      num = 0x7FFFFFFFL;
      FT_TRACE4(( "!!!OVERFLOW:!!!" ));
    }

    if ( sign )
      num = -num;

    return num;

  Bad:
    FT_TRACE4(( "!!!END OF DATA:!!!" ));
    return 0;
  }